

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<void_*>::setCapacity(Vector<void_*> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<void_*> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<void_*> newBuilder;
  size_t newSize_local;
  Vector<void_*> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<void_*>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<void_*>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<void*>((ArrayBuilder<void_*> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<void*>>(&this->builder);
  ArrayBuilder<void*>::addAll<kj::ArrayBuilder<void*>>((ArrayBuilder<void*> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<void*>>((ArrayBuilder<void_*> *)local_38);
  ArrayBuilder<void_*>::operator=(&this->builder,pAVar2);
  ArrayBuilder<void_*>::~ArrayBuilder((ArrayBuilder<void_*> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }